

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClassNameSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::ClassNameSyntax,slang::syntax::ClassNameSyntax_const&>
          (BumpAllocator *this,ClassNameSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ParameterValueAssignmentSyntax *pPVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ClassNameSyntax *pCVar10;
  
  pCVar10 = (ClassNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClassNameSyntax *)this->endPtr < pCVar10 + 1) {
    pCVar10 = (ClassNameSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pCVar10 + 1);
  }
  SVar8 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  TVar4 = (args->identifier).kind;
  uVar5 = (args->identifier).field_0x2;
  NVar6.raw = (args->identifier).numFlags.raw;
  uVar7 = (args->identifier).rawLen;
  pPVar3 = (args->parameters).ptr;
  (pCVar10->identifier).info = (args->identifier).info;
  (pCVar10->parameters).ptr = pPVar3;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode = pSVar2;
  (pCVar10->identifier).kind = TVar4;
  (pCVar10->identifier).field_0x2 = uVar5;
  (pCVar10->identifier).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar10->identifier).rawLen = uVar7;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar9;
  (pCVar10->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }